

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cortex_a9_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),5);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),8);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xb);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x21);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xc);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x1d);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc090;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x41033090;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x11110222;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0x1111111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x80038003;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0xc50078;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x1031;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 0x11;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x100103;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0x20000000;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1230000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x639) = 0x2111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x101111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x13112111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x21232041;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x11112131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x111142;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63c) = 0x35141000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0x9000003;
  obj[1].tb_jmp_cache[0x651] = (TranslationBlock *)0xe00fe019;
  obj[1].tb_jmp_cache[0x652] = (TranslationBlock *)0x200fe019;
  define_arm_cp_regs((ARMCPU *)obj,cortexa9_cp_reginfo);
  return;
}

Assistant:

static void cortex_a9_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_THUMB2EE);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    /* Note that A9 supports the MP extensions even for
     * A9UP and single-core A9MP (which are both different
     * and valid configurations; we don't model A9UP).
     */
    set_feature(&cpu->env, ARM_FEATURE_V7MP);
    set_feature(&cpu->env, ARM_FEATURE_CBAR);
    cpu->midr = 0x410fc090;
    cpu->reset_fpsid = 0x41033090;
    cpu->isar.mvfr0 = 0x11110222;
    cpu->isar.mvfr1 = 0x01111111;
    cpu->ctr = 0x80038003;
    cpu->reset_sctlr = 0x00c50078;
    cpu->id_pfr0 = 0x1031;
    cpu->id_pfr1 = 0x11;
    cpu->isar.id_dfr0 = 0x000;
    cpu->id_afr0 = 0;
    cpu->isar.id_mmfr0 = 0x00100103;
    cpu->isar.id_mmfr1 = 0x20000000;
    cpu->isar.id_mmfr2 = 0x01230000;
    cpu->isar.id_mmfr3 = 0x00002111;
    cpu->isar.id_isar0 = 0x00101111;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232041;
    cpu->isar.id_isar3 = 0x11112131;
    cpu->isar.id_isar4 = 0x00111142;
    cpu->isar.dbgdidr = 0x35141000;
    cpu->clidr = (1 << 27) | (1 << 24) | 3;
    cpu->ccsidr[0] = 0xe00fe019; /* 16k L1 dcache. */
    cpu->ccsidr[1] = 0x200fe019; /* 16k L1 icache. */
    define_arm_cp_regs(cpu, cortexa9_cp_reginfo);
}